

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O2

int Lpk_NodeHasChanged(Lpk_Man_t *p,int iNode)

{
  Vec_Ptr_t *p_00;
  void *pvVar1;
  Abc_Obj_t *pAVar2;
  int i;
  
  if ((-1 < iNode) && (iNode < p->vVisited->nSize)) {
    p_00 = (Vec_Ptr_t *)p->vVisited->pArray[(uint)iNode];
    if (p_00->nSize != 0) {
      i = 1;
      do {
        if (p_00->nSize <= i) {
          return 0;
        }
        pvVar1 = Vec_PtrEntry(p_00,i + -1);
        Vec_PtrEntry(p_00,i);
        pAVar2 = Abc_NtkObj(p->pNtk,(int)pvVar1);
        i = i + 2;
      } while (pAVar2 != (Abc_Obj_t *)0x0);
    }
    return 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
}

Assistant:

int Lpk_NodeHasChanged( Lpk_Man_t * p, int iNode )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pTemp, * pTemp2;
    int i;
    vNodes = Vec_VecEntry( p->vVisited, iNode );
    if ( Vec_PtrSize(vNodes) == 0 )
        return 1;
    Vec_PtrForEachEntryDouble( Abc_Obj_t *, Abc_Obj_t *, vNodes, pTemp, pTemp2, i )
    {
        // check if the node has changed
        pTemp = Abc_NtkObj( p->pNtk, (int)(ABC_PTRUINT_T)pTemp );
        if ( pTemp == NULL )
            return 1;
        // check if the number of fanouts has changed
//        if ( Abc_ObjFanoutNum(pTemp) != (int)Vec_PtrEntry(vNodes, i+1) )
//            return 1;
//        i++;
    }
    return 0;
}